

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct64_stage11_avx2(__m256i *output,__m256i *x)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  
  alVar1 = *x;
  alVar2 = x[0x3f];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  *output = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x3f] = alVar1;
  alVar1 = x[1];
  alVar2 = x[0x3e];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[1] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x3e] = alVar1;
  alVar1 = x[2];
  alVar2 = x[0x3d];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[2] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x3d] = alVar1;
  alVar1 = x[3];
  alVar2 = x[0x3c];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[3] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x3c] = alVar1;
  alVar1 = x[4];
  alVar2 = x[0x3b];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[4] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x3b] = alVar1;
  alVar1 = x[5];
  alVar2 = x[0x3a];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[5] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x3a] = alVar1;
  alVar1 = x[6];
  alVar2 = x[0x39];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[6] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x39] = alVar1;
  alVar1 = x[7];
  alVar2 = x[0x38];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[7] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x38] = alVar1;
  alVar1 = x[8];
  alVar2 = x[0x37];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[8] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x37] = alVar1;
  alVar1 = x[9];
  alVar2 = x[0x36];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[9] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x36] = alVar1;
  alVar1 = x[10];
  alVar2 = x[0x35];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[10] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x35] = alVar1;
  alVar1 = x[0xb];
  alVar2 = x[0x34];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xb] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x34] = alVar1;
  alVar1 = x[0xc];
  alVar2 = x[0x33];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xc] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x33] = alVar1;
  alVar1 = x[0xd];
  alVar2 = x[0x32];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xd] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x32] = alVar1;
  alVar1 = x[0xe];
  alVar2 = x[0x31];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xe] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x31] = alVar1;
  alVar1 = x[0xf];
  alVar2 = x[0x30];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xf] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x30] = alVar1;
  alVar1 = x[0x10];
  alVar2 = x[0x2f];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x10] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x2f] = alVar1;
  alVar1 = x[0x11];
  alVar2 = x[0x2e];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x11] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x2e] = alVar1;
  alVar1 = x[0x12];
  alVar2 = x[0x2d];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x12] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x2d] = alVar1;
  alVar1 = x[0x13];
  alVar2 = x[0x2c];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x13] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x2c] = alVar1;
  alVar1 = x[0x14];
  alVar2 = x[0x2b];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x14] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x2b] = alVar1;
  alVar1 = x[0x15];
  alVar2 = x[0x2a];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x15] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x2a] = alVar1;
  alVar1 = x[0x16];
  alVar2 = x[0x29];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x16] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x29] = alVar1;
  alVar1 = x[0x17];
  alVar2 = x[0x28];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x17] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x28] = alVar1;
  alVar1 = x[0x18];
  alVar2 = x[0x27];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x18] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x27] = alVar1;
  alVar1 = x[0x19];
  alVar2 = x[0x26];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x19] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x26] = alVar1;
  alVar1 = x[0x1a];
  alVar2 = x[0x25];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x1a] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x25] = alVar1;
  alVar1 = x[0x1b];
  alVar2 = x[0x24];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x1b] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x24] = alVar1;
  alVar1 = x[0x1c];
  alVar2 = x[0x23];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x1c] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x23] = alVar1;
  alVar1 = x[0x1d];
  alVar2 = x[0x22];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x1d] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x22] = alVar1;
  alVar1 = x[0x1e];
  alVar2 = x[0x21];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x1e] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x21] = alVar1;
  alVar1 = x[0x1f];
  alVar2 = x[0x20];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x1f] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0x20] = alVar1;
  return;
}

Assistant:

static inline void idct64_stage11_avx2(__m256i *u, __m256i *out, int do_cols,
                                       int bd, int out_shift,
                                       const __m256i *clamp_lo,
                                       const __m256i *clamp_hi) {
  for (int i = 0; i < 32; i++) {
    addsub_avx2(u[i], u[63 - i], &out[(i)], &out[(63 - i)], clamp_lo, clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_8x8_avx2(out, out_shift);
    round_shift_8x8_avx2(out + 16, out_shift);
    round_shift_8x8_avx2(out + 32, out_shift);
    round_shift_8x8_avx2(out + 48, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 64);
  }
}